

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O1

int __thiscall
QMetaEnumBuilderPrivate::addKey(QMetaEnumBuilderPrivate *this,QByteArray *name,quint64 value)

{
  qsizetype i;
  long in_FS_OFFSET;
  quint64 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  i = (this->keys).d.size;
  QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray_const&>
            ((QMovableArrayOps<QByteArray> *)&this->keys,i,name);
  QList<QByteArray>::end(&this->keys);
  local_30 = value;
  QtPrivate::QPodArrayOps<unsigned_long_long>::emplace<unsigned_long_long&>
            ((QPodArrayOps<unsigned_long_long> *)&this->values,(this->values).d.size,&local_30);
  QList<unsigned_long_long>::end(&this->values);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (int)i;
  }
  __stack_chk_fail();
}

Assistant:

int addKey(const QByteArray &name, quint64 value)
    {
        int index = keys.size();
        keys += name;
        values += value;
        return index;
    }